

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O3

GLvoid __thiscall gl4cts::anon_unknown_0::GatherBase::CreateTexture2DInt(GatherBase *this,bool rect)

{
  CallLogWrapper *this_00;
  int internalformat;
  GLenum target;
  undefined7 in_register_00000031;
  int i;
  int iVar1;
  ulong uVar2;
  allocator_type local_81;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  value_type local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  iVar1 = (int)CONCAT71(in_register_00000031,rect);
  target = 0xde1;
  if (iVar1 != 0) {
    target = 0x84f5;
  }
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,target,this->tex);
  if (iVar1 == 0) {
    uVar2 = 0x20;
    iVar1 = 0;
    do {
      glu::CallLogWrapper::glTexImage2D
                (this_00,target,iVar1,internalformat,(GLsizei)uVar2,(GLsizei)uVar2,0,0x8d99,0x1404,
                 (void *)0x0);
      iVar1 = iVar1 + 1;
      uVar2 = uVar2 >> 1;
    } while (iVar1 != 6);
  }
  else {
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x84f5,0,internalformat,0x20,0x20,0,0x8d99,0x1404,(void *)0x0);
  }
  local_68.m_data[0] = 999;
  local_68.m_data[1] = 999;
  local_68.m_data[2] = 999;
  local_68.m_data[3] = 999;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&pixels,0x400,&local_68,&local_81);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,target,0,0,0,0x20,0x20,0x8d99,0x1404,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  local_68.m_data[0] = 0xc;
  local_68.m_data[1] = 0xd;
  local_68.m_data[2] = 0xe;
  local_68.m_data[3] = 0xf;
  local_58 = 0x900000008;
  uStack_50 = 0xb0000000a;
  local_48 = 0x100000000;
  uStack_40 = 0x300000002;
  local_38 = 0x500000004;
  uStack_30 = 0x700000006;
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x16,0x19,2,2,0x8d99,0x1404,&local_68);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x10,10,1,1,0x8d99,0x1404,&local_68);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0xb,2,1,1,0x8d99,0x1404,&local_58);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x18,0xd,1,1,0x8d99,0x1404,&local_48);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,9,0xe,1,1,0x8d99,0x1404,&local_38);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
  if (pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pixels.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DInt(bool rect = false)
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		target			= rect ? GL_TEXTURE_RECTANGLE : GL_TEXTURE_2D;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		if (!rect)
		{
			for (int i = 0; size > 0; ++i, size /= 2)
			{
				glTexImage2D(target, i, internal_format, size, size, 0, GL_RGBA_INTEGER, GL_INT, 0);
			}
		}
		else
		{
			glTexImage2D(target, 0, internal_format, size, size, 0, GL_RGBA_INTEGER, GL_INT, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, GL_RGBA_INTEGER, GL_INT, &pixels[0]);

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		glTexSubImage2D(target, 0, 22, 25, 2, 2, GL_RGBA_INTEGER, GL_INT, data);
		glTexSubImage2D(target, 0, 16, 10, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 0);
		glTexSubImage2D(target, 0, 11, 2, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 1);
		glTexSubImage2D(target, 0, 24, 13, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 2);
		glTexSubImage2D(target, 0, 9, 14, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}